

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int cbs_get_two_digits(CBS *cbs,int *out)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint c;
  uint c_00;
  
  iVar3 = 0;
  iVar4 = 0;
  if (cbs->len != 0) {
    pbVar1 = cbs->data;
    cbs->data = pbVar1 + 1;
    cbs->len = cbs->len - 1;
    c_00 = (uint)*pbVar1;
    iVar2 = OPENSSL_isdigit(c_00);
    iVar4 = iVar3;
    if ((iVar2 != 0) && (cbs->len != 0)) {
      pbVar1 = cbs->data;
      cbs->data = pbVar1 + 1;
      cbs->len = cbs->len - 1;
      c = (uint)*pbVar1;
      iVar3 = OPENSSL_isdigit(c);
      if (iVar3 != 0) {
        *out = c + c_00 * 10 + -0x210;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}